

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# movegen.cpp
# Opt level: O1

void puppup::movegen::__impl::gen
               (Rack *r,idx step,idx cursor,idx orig_cursor,nodeid node,Gaddag *gaddag,State *state,
               idx non_multipliable_score,idx multipliable_score,idx word_mult,
               vector<puppup::movegen::Move,_std::allocator<puppup::movegen::Move>_> *outputs,
               bool best_only,array<long,_16384UL> *orthogonal_memo,idx blanks,idx placed)

{
  pointer *ppMVar1;
  long lVar2;
  pointer plVar3;
  pointer pMVar4;
  iterator __position;
  bool bVar5;
  long lVar6;
  idx word_mult_00;
  Rack *pRVar7;
  bool best_only_local;
  nodeid node_local;
  chr local_d8;
  idx cursor_local;
  idx step_local;
  idx orig_cursor_local;
  idx word_mult_new;
  anon_class_128_16_5f1c26f7 evaluate;
  
  word_mult_00 = word_mult;
  best_only_local = best_only;
  node_local = node;
  cursor_local = cursor;
  step_local = step;
  orig_cursor_local = orig_cursor;
  if (((step < 0 && cursor != orig_cursor) &&
      (lVar2 = (gaddag->nodes_).
               super__Vector_base<puppup::trie::Gaddag::Node,_std::allocator<puppup::trie::Gaddag::Node>_>
               ._M_impl.super__Vector_impl_data._M_start[node].children._M_elems[0x1f], lVar2 != -1)
      ) && ((0xf0 < (ulong)cursor || (cursor & 0x800000000000000fU) == 0xf ||
            ((*(long *)(board::word_multiplier + cursor * 8) == 0 ||
             ((state->board)._M_elems[cursor] == 0x1b)))))) {
    gen(r,-step,orig_cursor - step,orig_cursor,lVar2,gaddag,state,non_multipliable_score,
        multipliable_score,word_mult,outputs,best_only,orthogonal_memo,blanks,placed);
  }
  if (0 < step_local && 0 < placed) {
    plVar3 = (gaddag->node_to_word_).super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar2 = plVar3[node_local];
    if ((lVar2 != -1) &&
       (((0xf0 < (ulong)cursor_local || (cursor_local & 0x800000000000000fU) == 0xf ||
         (*(long *)(board::word_multiplier + cursor_local * 8) == 0)) ||
        ((state->board)._M_elems[cursor_local] == 0x1b)))) {
      lVar6 = multipliable_score * word_mult_00 + 0x23;
      if (placed < 7) {
        lVar6 = multipliable_score * word_mult_00;
      }
      pRVar7 = (Rack *)(lVar6 + non_multipliable_score);
      if ((best_only_local == true) &&
         (pMVar4 = (outputs->
                   super__Vector_base<puppup::movegen::Move,_std::allocator<puppup::movegen::Move>_>
                   )._M_impl.super__Vector_impl_data._M_finish,
         (outputs->super__Vector_base<puppup::movegen::Move,_std::allocator<puppup::movegen::Move>_>
         )._M_impl.super__Vector_impl_data._M_start != pMVar4)) {
        if (pMVar4[-1].score < (long)pRVar7) {
          pMVar4[-1].score = (idx)pRVar7;
          pMVar4[-1].word = lVar2;
          pMVar4[-1].cursor = cursor_local;
          pMVar4[-1].step = step_local;
          pMVar4[-1].blanks = blanks;
        }
      }
      else {
        evaluate.state = (State *)plVar3[node_local];
        evaluate.cursor = (idx *)cursor_local;
        evaluate.j = (chr *)step_local;
        evaluate.blanks = (idx *)blanks;
        __position._M_current =
             (outputs->
             super__Vector_base<puppup::movegen::Move,_std::allocator<puppup::movegen::Move>_>).
             _M_impl.super__Vector_impl_data._M_finish;
        evaluate.r = pRVar7;
        if (__position._M_current ==
            (outputs->
            super__Vector_base<puppup::movegen::Move,_std::allocator<puppup::movegen::Move>_>).
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<puppup::movegen::Move,_std::allocator<puppup::movegen::Move>_>::
          _M_realloc_insert<puppup::movegen::Move>(outputs,__position,(Move *)&evaluate);
        }
        else {
          (__position._M_current)->blanks = blanks;
          (__position._M_current)->score = (idx)pRVar7;
          (__position._M_current)->word = (idx)evaluate.state;
          (__position._M_current)->cursor = cursor_local;
          (__position._M_current)->step = step_local;
          ppMVar1 = &(outputs->
                     super__Vector_base<puppup::movegen::Move,_std::allocator<puppup::movegen::Move>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
          *ppMVar1 = *ppMVar1 + 1;
        }
      }
    }
  }
  if (((ulong)cursor_local < 0xf1 && (cursor_local & 0x800000000000000fU) != 0xf) &&
     (*(long *)(board::word_multiplier + cursor_local * 8) != 0)) {
    lVar2 = (state->board)._M_elems[cursor_local];
    if (lVar2 == 0x1b) {
      word_mult_new = word_mult_00 * *(long *)(board::word_multiplier + cursor_local * 8);
      local_d8 = 0;
      do {
        if ((gaddag->nodes_).
            super__Vector_base<puppup::trie::Gaddag::Node,_std::allocator<puppup::trie::Gaddag::Node>_>
            ._M_impl.super__Vector_impl_data._M_start[node_local].children._M_elems[local_d8] != -1)
        {
          evaluate.state = state;
          evaluate.cursor = &cursor_local;
          evaluate.j = &local_d8;
          evaluate.blanks = &blanks;
          evaluate.orthogonal_memo = orthogonal_memo;
          evaluate.step = &step_local;
          evaluate.orig_cursor = &orig_cursor_local;
          evaluate.node = &node_local;
          evaluate.non_multipliable_score = &non_multipliable_score;
          evaluate.word_mult_new = &word_mult_new;
          evaluate.outputs = outputs;
          evaluate.r = r;
          evaluate.gaddag = gaddag;
          evaluate.multipliable_score = &multipliable_score;
          evaluate.best_only = &best_only_local;
          evaluate.placed = &placed;
          if (r->_M_elems[local_d8] != 0) {
            gen::anon_class_128_16_5f1c26f7::operator()(&evaluate,local_d8);
          }
          if (r->_M_elems[0x1a] != 0) {
            gen::anon_class_128_16_5f1c26f7::operator()(&evaluate,0x1a);
          }
        }
        bVar5 = local_d8 < 0x1a;
        local_d8 = local_d8 + 1;
      } while (bVar5);
    }
    else {
      lVar2 = (gaddag->nodes_).
              super__Vector_base<puppup::trie::Gaddag::Node,_std::allocator<puppup::trie::Gaddag::Node>_>
              ._M_impl.super__Vector_impl_data._M_start[node_local].children._M_elems[lVar2];
      if (lVar2 != -1) {
        gen(r,step_local,step_local + cursor_local,orig_cursor_local,lVar2,gaddag,state,
            non_multipliable_score,(state->letter_score)._M_elems[cursor_local] + multipliable_score
            ,word_mult_00,outputs,best_only_local,orthogonal_memo,blanks,placed);
      }
    }
  }
  return;
}

Assistant:

void gen(Rack& r, idx step, idx cursor, idx orig_cursor, trie::nodeid node,
         const trie::Gaddag& gaddag, board::State& state,
         idx non_multipliable_score, idx multipliable_score, idx word_mult,
         std::vector<Move>& outputs, const bool best_only,
         std::array<idx, 256 * 32 * 2>& orthogonal_memo, idx blanks,
         idx placed) {
    // we have gone far enough in the reverse direction, time to turn around
    if (cursor != orig_cursor && step < 0 &&
        (gaddag.has(node, trie::rev_marker) &&
         (edge(cursor) || state.board[cursor] == emptiness))) {
        gen(r, -step, orig_cursor - step, orig_cursor,
            gaddag.get(node, trie::rev_marker), gaddag, state,
            non_multipliable_score, multipliable_score, word_mult, outputs,
            best_only, orthogonal_memo, blanks, placed);
    }
    // we have found a valid word
    if (placed > 0 && step > 0 && gaddag.exists(node) &&
        (edge(cursor) || state.board[cursor] == emptiness)) {
        idx score = non_multipliable_score + multipliable_score * word_mult;
        if (placed >= 7) score += bingo_bonus;
        if (!best_only || outputs.empty()) {
            outputs.push_back(
                {score, gaddag.nodeToWord(node), cursor, step, blanks});
        } else {
            if (score > outputs.back().score) {
                outputs.back() = {score, gaddag.nodeToWord(node), cursor, step,
                                  blanks};
            }
        }
    }
    // we have gone out of bounds
    if (edge(cursor)) {
        return;
    }
    // traverse over undiscovered land
    if (state.board[cursor] == emptiness) {
        idx word_mult_new = word_mult * board::word_multiplier[cursor];
        /*
        for (trie::nodeid child = gaddag.firstChild(node);
             child != trie::invalid; child = gaddag.nextSibling(child)) {
            chr j = gaddag.val(child);
            if (j >= emptiness) break;
            */
        for (chr j = 0; j < emptiness; ++j) {
            if (!gaddag.has(node, j)) continue;
            auto evaluate = [&](const chr i) {
                --r[i];
                state.board[cursor] = j;
                state.letter_score[cursor] = scores[i];
                idx newblanks = blanks;
                idx blankness = 0;
                if (i == blank) {
                    blankness = 1;
                    newblanks <<= idx(16LL);
                    newblanks |= cursor + 1;
                }
                idx orth_score =
                    orthogonal_memo[2 * (cursor * 32 + j) + blankness];
                if (orth_score == -2) {
                    orth_score = orthogonal(turn(step), cursor, gaddag, state);
                    orthogonal_memo[2 * (cursor * 32 + j) + blankness] =
                        orth_score;
                }
                if (orth_score >= 0) {
                    gen(r, step, cursor + step, orig_cursor,
                        gaddag.get(node, j), gaddag, state,
                        non_multipliable_score + orth_score,
                        multipliable_score +
                            scores[i] * board::letter_multiplier[cursor],
                        word_mult_new, outputs, best_only, orthogonal_memo,
                        newblanks, placed + 1);
                }
                state.board[cursor] = emptiness;
                state.letter_score[cursor] = 0;
                ++r[i];
            };
            if (r[j]) evaluate(j);
            if (r[blank]) evaluate(blank);
        }
    } else {
        // traverse over existing tiles
        const chr i = state.board[cursor];
        if (gaddag.has(node, i)) {
            gen(r, step, cursor + step, orig_cursor, gaddag.get(node, i),
                gaddag, state, non_multipliable_score,
                multipliable_score + state.letter_score[cursor], word_mult,
                outputs, best_only, orthogonal_memo, blanks, placed);
        }
    }
}